

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbaselib.c
# Opt level: O2

int luaB_next(lua_State *L)

{
  int iVar1;
  int iVar2;
  
  luaL_checktype(L,1,5);
  lua_settop(L,2);
  iVar1 = lua_next(L,1);
  iVar2 = 2;
  if (iVar1 == 0) {
    lua_pushnil(L);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int luaB_next(lua_State *L) {
    luaL_checktype(L, 1, LUA_TTABLE);
    lua_settop(L, 2);  /* create a 2nd argument if there isn't one */
    if (lua_next(L, 1))
        return 2;
    else {
        lua_pushnil(L);
        return 1;
    }
}